

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

Error * ot::commissioner::CommissionerImpl::EncodeCommissionerDataset
                  (Error *__return_storage_ptr__,Request *aRequest,CommissionerDataset *aDataset)

{
  ushort uVar1;
  ErrorCode EVar2;
  Error *pEVar3;
  Tlv TStack_68;
  undefined1 local_48 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  uVar1 = aDataset->mPresentFlags;
  if ((uVar1 >> 0xe & 1) != 0) {
    tlv::Tlv::Tlv(&TStack_68,kCommissionerSessionId,aDataset->mSessionId,kMeshCoP);
    AppendTlv((Error *)local_48,aRequest,&TStack_68);
    pEVar3 = Error::operator=(__return_storage_ptr__,(Error *)local_48);
    EVar2 = pEVar3->mCode;
    std::__cxx11::string::~string((string *)(local_48 + 8));
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&TStack_68.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    uVar1 = aDataset->mPresentFlags;
  }
  if ((short)uVar1 < 0) {
    tlv::Tlv::Tlv(&TStack_68,kBorderAgentLocator,aDataset->mBorderAgentLocator,kMeshCoP);
    AppendTlv((Error *)local_48,aRequest,&TStack_68);
    pEVar3 = Error::operator=(__return_storage_ptr__,(Error *)local_48);
    EVar2 = pEVar3->mCode;
    std::__cxx11::string::~string((string *)(local_48 + 8));
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&TStack_68.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    uVar1 = aDataset->mPresentFlags;
  }
  if ((uVar1 >> 0xd & 1) != 0) {
    tlv::Tlv::Tlv(&TStack_68,kNetworkDiagIpv6Address,&aDataset->mSteeringData,kMeshCoP);
    AppendTlv((Error *)local_48,aRequest,&TStack_68);
    pEVar3 = Error::operator=(__return_storage_ptr__,(Error *)local_48);
    EVar2 = pEVar3->mCode;
    std::__cxx11::string::~string((string *)(local_48 + 8));
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&TStack_68.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    uVar1 = aDataset->mPresentFlags;
  }
  if ((uVar1 >> 0xc & 1) != 0) {
    tlv::Tlv::Tlv(&TStack_68,kAeSteeringData,&aDataset->mAeSteeringData,kMeshCoP);
    AppendTlv((Error *)local_48,aRequest,&TStack_68);
    pEVar3 = Error::operator=(__return_storage_ptr__,(Error *)local_48);
    EVar2 = pEVar3->mCode;
    std::__cxx11::string::~string((string *)(local_48 + 8));
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&TStack_68.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    uVar1 = aDataset->mPresentFlags;
  }
  if ((uVar1 >> 0xb & 1) != 0) {
    tlv::Tlv::Tlv(&TStack_68,kNmkpSteeringData,&aDataset->mNmkpSteeringData,kMeshCoP);
    AppendTlv((Error *)local_48,aRequest,&TStack_68);
    pEVar3 = Error::operator=(__return_storage_ptr__,(Error *)local_48);
    EVar2 = pEVar3->mCode;
    std::__cxx11::string::~string((string *)(local_48 + 8));
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&TStack_68.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    uVar1 = aDataset->mPresentFlags;
  }
  if ((uVar1 >> 10 & 1) != 0) {
    tlv::Tlv::Tlv(&TStack_68,kJoinerUdpPort,aDataset->mJoinerUdpPort,kMeshCoP);
    AppendTlv((Error *)local_48,aRequest,&TStack_68);
    pEVar3 = Error::operator=(__return_storage_ptr__,(Error *)local_48);
    EVar2 = pEVar3->mCode;
    std::__cxx11::string::~string((string *)(local_48 + 8));
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&TStack_68.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    uVar1 = aDataset->mPresentFlags;
  }
  if ((uVar1 >> 9 & 1) != 0) {
    tlv::Tlv::Tlv(&TStack_68,kAeUdpPort,aDataset->mAeUdpPort,kMeshCoP);
    AppendTlv((Error *)local_48,aRequest,&TStack_68);
    pEVar3 = Error::operator=(__return_storage_ptr__,(Error *)local_48);
    EVar2 = pEVar3->mCode;
    std::__cxx11::string::~string((string *)(local_48 + 8));
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&TStack_68.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    uVar1 = aDataset->mPresentFlags;
  }
  if ((uVar1 >> 8 & 1) != 0) {
    tlv::Tlv::Tlv(&TStack_68,kNmkpUdpPort,aDataset->mNmkpUdpPort,kMeshCoP);
    AppendTlv((Error *)local_48,aRequest,&TStack_68);
    Error::operator=(__return_storage_ptr__,(Error *)local_48);
    std::__cxx11::string::~string((string *)(local_48 + 8));
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&TStack_68.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::EncodeCommissionerDataset(coap::Request &aRequest, const CommissionerDataset &aDataset)
{
    Error error;

    if (aDataset.mPresentFlags & CommissionerDataset::kSessionIdBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kCommissionerSessionId, aDataset.mSessionId}));
    }

    if (aDataset.mPresentFlags & CommissionerDataset::kBorderAgentLocatorBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kBorderAgentLocator, aDataset.mBorderAgentLocator}));
    }

    if (aDataset.mPresentFlags & CommissionerDataset::kSteeringDataBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kSteeringData, aDataset.mSteeringData}));
    }

    if (aDataset.mPresentFlags & CommissionerDataset::kAeSteeringDataBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kAeSteeringData, aDataset.mAeSteeringData}));
    }

    if (aDataset.mPresentFlags & CommissionerDataset::kNmkpSteeringDataBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kNmkpSteeringData, aDataset.mNmkpSteeringData}));
    }

    if (aDataset.mPresentFlags & CommissionerDataset::kJoinerUdpPortBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kJoinerUdpPort, aDataset.mJoinerUdpPort}));
    }

    if (aDataset.mPresentFlags & CommissionerDataset::kAeUdpPortBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kAeUdpPort, aDataset.mAeUdpPort}));
    }

    if (aDataset.mPresentFlags & CommissionerDataset::kNmkpUdpPortBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kNmkpUdpPort, aDataset.mNmkpUdpPort}));
    }

exit:
    return error;
}